

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O3

void MNS::Server::onSecondTimer(uv_timer_t *handle)

{
  size_type sVar1;
  tm *__tp;
  time_t t;
  char strt [100];
  time_t local_90;
  char local_88 [112];
  
  local_90 = time((time_t *)0x0);
  __tp = gmtime(&local_90);
  strftime(local_88,100,"%a, %e %b %Y %H:%M:%S GMT",__tp);
  sVar1 = currTime_abi_cxx11_._M_string_length;
  strlen(local_88);
  std::__cxx11::string::_M_replace(0x10f278,0,(char *)sVar1,(ulong)local_88);
  return;
}

Assistant:

void MNS::Server::onSecondTimer(uv_timer_t *handle) {
	char strt[100];
	std::time_t t = std::time(NULL);
	std::strftime(strt, 100, "%a, %e %b %Y %H:%M:%S GMT\0", std::gmtime(&t));

	MNS::Server::currTime = strt;
}